

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprCheckPoslists(Fts5ExprNode *pNode,i64 iRowid)

{
  int iVar1;
  int local_2c;
  int local_28;
  int bRet;
  int i_1;
  int i;
  i64 iRowid_local;
  Fts5ExprNode *pNode_local;
  
  pNode->iRowid = iRowid;
  pNode->bEof = 0;
  switch(pNode->eType) {
  case 1:
    local_2c = 0;
    for (local_28 = 0; local_28 < pNode->nChild; local_28 = local_28 + 1) {
      iVar1 = fts5ExprCheckPoslists(pNode->apChild[local_28],iRowid);
      if (iVar1 != 0) {
        local_2c = 1;
      }
    }
    return local_2c;
  case 2:
    for (bRet = 0; bRet < pNode->nChild; bRet = bRet + 1) {
      iVar1 = fts5ExprCheckPoslists(pNode->apChild[bRet],iRowid);
      if (iVar1 == 0) {
        fts5ExprClearPoslists(pNode);
        return 0;
      }
    }
    break;
  default:
    iVar1 = fts5ExprCheckPoslists(pNode->apChild[0],iRowid);
    if ((iVar1 == 0) ||
       (iVar1 = fts5ExprCheckPoslists(*(Fts5ExprNode **)(pNode + 1),iRowid), iVar1 != 0)) {
      fts5ExprClearPoslists(pNode);
      return 0;
    }
    break;
  case 4:
  case 9:
    return (uint)(0 < (pNode->pNear->apPhrase[0]->poslist).n);
  }
  return 1;
}

Assistant:

static int fts5ExprCheckPoslists(Fts5ExprNode *pNode, i64 iRowid){
  pNode->iRowid = iRowid;
  pNode->bEof = 0;
  switch( pNode->eType ){
    case FTS5_TERM:
    case FTS5_STRING:
      return (pNode->pNear->apPhrase[0]->poslist.n>0);

    case FTS5_AND: {
      int i;
      for(i=0; i<pNode->nChild; i++){
        if( fts5ExprCheckPoslists(pNode->apChild[i], iRowid)==0 ){
          fts5ExprClearPoslists(pNode);
          return 0;
        }
      }
      break;
    }

    case FTS5_OR: {
      int i;
      int bRet = 0;
      for(i=0; i<pNode->nChild; i++){
        if( fts5ExprCheckPoslists(pNode->apChild[i], iRowid) ){
          bRet = 1;
        }
      }
      return bRet;
    }

    default: {
      assert( pNode->eType==FTS5_NOT );
      if( 0==fts5ExprCheckPoslists(pNode->apChild[0], iRowid)
          || 0!=fts5ExprCheckPoslists(pNode->apChild[1], iRowid)
        ){
        fts5ExprClearPoslists(pNode);
        return 0;
      }
      break;
    }
  }
  return 1;
}